

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlRegPrintState(FILE *output,xmlRegStatePtr state)

{
  int local_1c;
  int i;
  xmlRegStatePtr state_local;
  FILE *output_local;
  
  fprintf((FILE *)output," state: ");
  if (state == (xmlRegStatePtr)0x0) {
    fprintf((FILE *)output,"NULL\n");
  }
  else {
    if (state->type == XML_REGEXP_START_STATE) {
      fprintf((FILE *)output,"START ");
    }
    if (state->type == XML_REGEXP_FINAL_STATE) {
      fprintf((FILE *)output,"FINAL ");
    }
    fprintf((FILE *)output,"%d, %d transitions:\n",(ulong)(uint)state->no,
            (ulong)(uint)state->nbTrans);
    for (local_1c = 0; local_1c < state->nbTrans; local_1c = local_1c + 1) {
      xmlRegPrintTrans(output,state->trans + local_1c);
    }
  }
  return;
}

Assistant:

static void
xmlRegPrintState(FILE *output, xmlRegStatePtr state) {
    int i;

    fprintf(output, " state: ");
    if (state == NULL) {
	fprintf(output, "NULL\n");
	return;
    }
    if (state->type == XML_REGEXP_START_STATE)
	fprintf(output, "START ");
    if (state->type == XML_REGEXP_FINAL_STATE)
	fprintf(output, "FINAL ");

    fprintf(output, "%d, %d transitions:\n", state->no, state->nbTrans);
    for (i = 0;i < state->nbTrans; i++) {
	xmlRegPrintTrans(output, &(state->trans[i]));
    }
}